

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qparallelanimationgroup.cpp
# Opt level: O2

void __thiscall
QParallelAnimationGroupPrivate::_q_uncontrolledAnimationFinished
          (QParallelAnimationGroupPrivate *this)

{
  QObject *this_00;
  QAbstractAnimation **ppQVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  QObject *object;
  QAbstractAnimation *this_01;
  Span *pSVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long in_FS_OFFSET;
  piter local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
            super_QObjectPrivate.super_QObjectData.q_ptr;
  object = QObject::sender(this_00);
  this_01 = (QAbstractAnimation *)
            QtPrivate::qobject_cast_helper<QAbstractAnimation*,QObject>(object);
  iVar3 = (**(code **)(*(long *)this_01 + 0x60))(this_01);
  if (iVar3 == -1) {
LAB_0036668c:
    local_48 = (piter)QHash<QAbstractAnimation_*,_int>::begin(&this->uncontrolledFinishTime);
    iVar3 = 0;
    while( true ) {
      if (local_48.d == (Data<QHashPrivate::Node<QAbstractAnimation_*,_int>_> *)0x0 &&
          local_48.bucket == 0) break;
      pSVar5 = (local_48.d)->spans;
      uVar7 = local_48.bucket >> 7;
      uVar6 = (ulong)((uint)local_48.bucket & 0x7f);
      if (*(QAbstractAnimation **)pSVar5[uVar7].entries[pSVar5[uVar7].offsets[uVar6]].storage.data
          == this_01) {
        iVar4 = QAbstractAnimation::currentTime(this_01);
        pSVar5 = (local_48.d)->spans;
        uVar7 = local_48.bucket >> 7;
        uVar6 = (ulong)((uint)local_48.bucket & 0x7f);
        *(int *)(pSVar5[uVar7].entries[pSVar5[uVar7].offsets[uVar6]].storage.data + 8) = iVar4;
      }
      iVar3 = iVar3 + (uint)(*(int *)(pSVar5[uVar7].entries[pSVar5[uVar7].offsets[uVar6]].storage.
                                      data + 8) == -1);
      QHashPrivate::iterator<QHashPrivate::Node<QAbstractAnimation_*,_int>_>::operator++(&local_48);
    }
    if (iVar3 != 0) goto LAB_003667a1;
  }
  else {
    iVar3 = QAbstractAnimation::loopCount(this_01);
    if (iVar3 < 0) goto LAB_0036668c;
  }
  ppQVar1 = (this->super_QAnimationGroupPrivate).animations.d.ptr;
  lVar2 = (this->super_QAnimationGroupPrivate).animations.d.size;
  iVar3 = 0;
  for (lVar8 = 0; lVar2 << 3 != lVar8; lVar8 = lVar8 + 8) {
    iVar4 = QAbstractAnimation::totalDuration(*(QAbstractAnimation **)((long)ppQVar1 + lVar8));
    if (iVar3 <= iVar4) {
      iVar3 = iVar4;
    }
  }
  if (iVar3 <= (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.currentTime) {
    QAbstractAnimation::stop((QAbstractAnimation *)this_00);
  }
LAB_003667a1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QParallelAnimationGroupPrivate::_q_uncontrolledAnimationFinished()
{
    Q_Q(QParallelAnimationGroup);

    QAbstractAnimation *animation = qobject_cast<QAbstractAnimation *>(q->sender());
    Q_ASSERT(animation);

    int uncontrolledRunningCount = 0;
    if (animation->duration() == -1 || animation->loopCount() < 0) {
        for (AnimationTimeHashIt it = uncontrolledFinishTime.begin(), cend = uncontrolledFinishTime.end(); it != cend; ++it) {
            if (it.key() == animation) {
                *it = animation->currentTime();
            }
            if (it.value() == -1)
                ++uncontrolledRunningCount;
        }
    }

    if (uncontrolledRunningCount > 0)
        return;

    int maxDuration = 0;
    for (AnimationListConstIt it = animations.constBegin(), cend = animations.constEnd(); it != cend; ++it)
        maxDuration = qMax(maxDuration, (*it)->totalDuration());

    if (currentTime >= maxDuration)
        q->stop();
}